

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

void image_manipulation::resize_and_pad_image
               (clip_image_u8 *image,clip_image_u8 *dst,clip_image_size *target_resolution,
               array<unsigned_char,_3UL> pad_color)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  clip_image_u8 *pcVar4;
  reference pvVar5;
  reference pvVar6;
  undefined4 in_ECX;
  int *in_RDX;
  int *in_RDI;
  double dVar7;
  int c;
  int x;
  int y;
  int pad_y;
  int pad_x;
  size_t i;
  clip_image_u8 padded_image;
  clip_image_u8 resized_image;
  int new_height;
  int new_width;
  float scale_h;
  float scale_w;
  int target_height;
  int target_width;
  undefined4 in_stack_ffffffffffffff38;
  value_type in_stack_ffffffffffffff3c;
  value_type_conflict5 in_stack_ffffffffffffff3d;
  value_type_conflict5 in_stack_ffffffffffffff3e;
  value_type_conflict5 in_stack_ffffffffffffff3f;
  clip_image_u8 *this;
  int local_ac;
  undefined4 in_stack_ffffffffffffff58;
  int iVar8;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar9;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  clip_image_u8 *local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88 [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_58;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  float local_30;
  float local_2c;
  int local_28;
  int local_24 [8];
  undefined2 local_3;
  undefined1 local_1;
  
  local_3 = (undefined2)in_ECX;
  local_1 = (undefined1)((uint)in_ECX >> 0x10);
  local_34 = *in_RDX;
  local_38 = in_RDX[1];
  local_2c = (float)local_34 / (float)*in_RDI;
  local_30 = (float)local_38 / (float)in_RDI[1];
  local_28 = local_38;
  local_24[0] = local_34;
  if (local_30 <= local_2c) {
    dVar7 = std::ceil((double)(ulong)(uint)((float)*in_RDI * local_30));
    local_40 = (int)SUB84(dVar7,0);
    piVar3 = std::min<int>(&local_40,local_24);
    local_34 = *piVar3;
  }
  else {
    dVar7 = std::ceil((double)(ulong)(uint)((float)in_RDI[1] * local_2c));
    local_3c = (int)SUB84(dVar7,0);
    piVar3 = std::min<int>(&local_3c,&local_28);
    local_38 = *piVar3;
  }
  clip_image_u8::clip_image_u8((clip_image_u8 *)0x1902a9);
  bicubic_resize((clip_image_u8 *)i,_pad_y,y,x);
  clip_image_u8::clip_image_u8((clip_image_u8 *)0x1902d5);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  local_98 = (clip_image_u8 *)0x0;
  while( true ) {
    this = local_98;
    pcVar4 = (clip_image_u8 *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_88);
    if (pcVar4 <= this) break;
    pvVar5 = std::array<unsigned_char,_3UL>::operator[]
                       ((array<unsigned_char,_3UL> *)this,
                        CONCAT17(in_stack_ffffffffffffff3f,
                                 CONCAT16(in_stack_ffffffffffffff3e,
                                          CONCAT15(in_stack_ffffffffffffff3d,
                                                   CONCAT14(in_stack_ffffffffffffff3c,
                                                            in_stack_ffffffffffffff38)))));
    in_stack_ffffffffffffff3d = *pvVar5;
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (local_88,(size_type)local_98);
    *pvVar6 = in_stack_ffffffffffffff3d;
    pvVar5 = std::array<unsigned_char,_3UL>::operator[]
                       ((array<unsigned_char,_3UL> *)this,
                        CONCAT17(in_stack_ffffffffffffff3f,
                                 CONCAT16(in_stack_ffffffffffffff3e,
                                          CONCAT15(in_stack_ffffffffffffff3d,
                                                   CONCAT14(in_stack_ffffffffffffff3c,
                                                            in_stack_ffffffffffffff38)))));
    in_stack_ffffffffffffff3e = *pvVar5;
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (local_88,(size_type)((long)&local_98->nx + 1));
    *pvVar6 = in_stack_ffffffffffffff3e;
    pvVar5 = std::array<unsigned_char,_3UL>::operator[]
                       ((array<unsigned_char,_3UL> *)this,
                        CONCAT17(in_stack_ffffffffffffff3f,
                                 CONCAT16(in_stack_ffffffffffffff3e,
                                          CONCAT15(in_stack_ffffffffffffff3d,
                                                   CONCAT14(in_stack_ffffffffffffff3c,
                                                            in_stack_ffffffffffffff38)))));
    in_stack_ffffffffffffff3f = *pvVar5;
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (local_88,(size_type)((long)&local_98->nx + 2));
    *pvVar6 = in_stack_ffffffffffffff3f;
    local_98 = (clip_image_u8 *)((long)&local_98->nx + 3);
  }
  iVar1 = (local_24[0] - local_34) / 2;
  iVar2 = (local_28 - local_38) / 2;
  for (iVar9 = 0; iVar9 < local_38; iVar9 = iVar9 + 1) {
    for (iVar8 = 0; iVar8 < local_34; iVar8 = iVar8 + 1) {
      for (local_ac = 0; local_ac < 3; local_ac = local_ac + 1) {
        pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&vStack_58,(long)((iVar9 * local_34 + iVar8) * 3 + local_ac));
        in_stack_ffffffffffffff3c = *pvVar6;
        pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (local_88,(long)(((iVar9 + iVar2) * local_24[0] + iVar8 + iVar1) * 3 +
                                           local_ac));
        *pvVar6 = in_stack_ffffffffffffff3c;
      }
    }
  }
  clip_image_u8::operator=
            (this,(clip_image_u8 *)
                  CONCAT17(in_stack_ffffffffffffff3f,
                           CONCAT16(in_stack_ffffffffffffff3e,
                                    CONCAT15(in_stack_ffffffffffffff3d,
                                             CONCAT14(in_stack_ffffffffffffff3c,
                                                      in_stack_ffffffffffffff38)))));
  clip_image_u8::~clip_image_u8((clip_image_u8 *)0x190547);
  clip_image_u8::~clip_image_u8((clip_image_u8 *)0x190551);
  return;
}

Assistant:

static void resize_and_pad_image(const clip_image_u8 & image, clip_image_u8 & dst, const clip_image_size & target_resolution, std::array<uint8_t, 3> pad_color = {0, 0, 0}) {
        int target_width  = target_resolution.width;
        int target_height = target_resolution.height;

        float scale_w = static_cast<float>(target_width) / image.nx;
        float scale_h = static_cast<float>(target_height) / image.ny;

        int new_width, new_height;

        if (scale_w < scale_h) {
            new_width  = target_width;
            new_height = std::min(static_cast<int>(std::ceil(image.ny * scale_w)), target_height);
        } else {
            new_height = target_height;
            new_width  = std::min(static_cast<int>(std::ceil(image.nx * scale_h)), target_width);
        }

        clip_image_u8 resized_image;
        bicubic_resize(image, resized_image, new_width, new_height);

        clip_image_u8 padded_image;
        padded_image.nx = target_width;
        padded_image.ny = target_height;
        padded_image.buf.resize(3 * target_width * target_height);

        // Fill the padded image with the fill color
        for (size_t i = 0; i < padded_image.buf.size(); i += 3) {
            padded_image.buf[i]     = pad_color[0];
            padded_image.buf[i + 1] = pad_color[1];
            padded_image.buf[i + 2] = pad_color[2];
        }

        // Calculate padding offsets
        int pad_x = (target_width  - new_width)  / 2;
        int pad_y = (target_height - new_height) / 2;

        // Copy the resized image into the center of the padded buffer
        for (int y = 0; y < new_height; ++y) {
            for (int x = 0; x < new_width; ++x) {
                for (int c = 0; c < 3; ++c) {
                    padded_image.buf[3 * ((y + pad_y) * target_width + (x + pad_x)) + c] = resized_image.buf[3 * (y * new_width + x) + c];
                }
            }
        }
        dst = std::move(padded_image);
    }